

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_privkey.cpp
# Opt level: O0

void __thiscall
Privkey_FromWif_testnet_compressed_Test::TestBody(Privkey_FromWif_testnet_compressed_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *rhs;
  char *in_R9;
  AssertHelper local_178;
  Message local_170;
  string local_168;
  undefined1 local_148 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_118;
  Message local_110;
  bool local_101;
  undefined1 local_100 [8];
  AssertionResult gtest_ar_;
  string local_e8;
  undefined1 local_c8 [8];
  Privkey from_hex;
  Message local_a0;
  string local_98;
  undefined1 local_78 [8];
  AssertionResult gtest_ar;
  Privkey privkey;
  allocator local_31;
  undefined1 local_30 [8];
  string wif;
  Privkey_FromWif_testnet_compressed_Test *this_local;
  
  wif.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_30,"cPCirFtGH3KUJ4ZusGdRUiW5iL3Y2PEM9gxSMRM3YSG6Eon9heJj",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  cfd::core::Privkey::FromWif((Privkey *)&gtest_ar.message_,(string *)local_30,kTestnet,true);
  cfd::core::Privkey::GetHex_abi_cxx11_(&local_98,(Privkey *)&gtest_ar.message_);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_78,"privkey.GetHex().c_str()",
             "\"305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27\"",pcVar2,
             "305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27");
  std::__cxx11::string::~string((string *)&local_98);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&from_hex.is_compressed_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_privkey.cpp"
               ,0x90,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&from_hex.is_compressed_,&local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&from_hex.is_compressed_);
    testing::Message::~Message(&local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_e8,"305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27",
             (allocator *)((long)&gtest_ar_.message_.ptr_ + 7));
  cfd::core::Privkey::Privkey((Privkey *)local_c8,&local_e8,kMainnet,true);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  local_101 = cfd::core::Privkey::Equals((Privkey *)&gtest_ar.message_,(Privkey *)local_c8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_100,&local_101,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar1) {
    testing::Message::Message(&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_100,
               (AssertionResult *)"privkey.Equals(from_hex)","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_privkey.cpp"
               ,0x93,pcVar2);
    testing::internal::AssertHelper::operator=(&local_118,&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_110);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  cfd::core::Privkey::GetWif_abi_cxx11_(&local_168,(Privkey *)&gtest_ar.message_);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  rhs = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_148,"privkey.GetWif().c_str()","wif.c_str()",pcVar2,rhs);
  std::__cxx11::string::~string((string *)&local_168);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar1) {
    testing::Message::Message(&local_170);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_privkey.cpp"
               ,0x95,pcVar2);
    testing::internal::AssertHelper::operator=(&local_178,&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    testing::Message::~Message(&local_170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  cfd::core::Privkey::~Privkey((Privkey *)local_c8);
  cfd::core::Privkey::~Privkey((Privkey *)&gtest_ar.message_);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(Privkey, FromWif_testnet_compressed) {
  std::string wif = "cPCirFtGH3KUJ4ZusGdRUiW5iL3Y2PEM9gxSMRM3YSG6Eon9heJj";
  Privkey privkey = Privkey::FromWif(wif, NetType::kTestnet, true);
  EXPECT_STREQ(
      privkey.GetHex().c_str(),
      "305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27");

  Privkey from_hex("305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27");
  EXPECT_TRUE(privkey.Equals(from_hex));

  EXPECT_STREQ(privkey.GetWif().c_str(), wif.c_str());
}